

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3Init(sqlite3 *db,char **pzErrMsg)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  
  uVar1 = db->flags;
  (db->init).busy = '\x01';
  db->enc = db->aDb->pSchema->enc;
  lVar5 = 0;
  lVar4 = 0x18;
  iVar3 = 0;
  do {
    if (iVar3 != 0) {
LAB_00118bad:
      (db->init).busy = '\0';
      return iVar3;
    }
    if (db->nDb <= lVar5) {
      if ((((db->aDb[1].pSchema)->schemaFlags & 1) != 0) ||
         (iVar3 = sqlite3InitOne(db,1,pzErrMsg), iVar3 == 0)) {
        (db->init).busy = '\0';
        if ((uVar1 & 2) != 0) {
          return 0;
        }
        *(byte *)&db->flags = (byte)db->flags & 0xfd;
        return 0;
      }
      sqlite3ResetOneSchema(db,1);
      goto LAB_00118bad;
    }
    iVar3 = 0;
    if (lVar5 != 1 && (*(byte *)(*(long *)((long)&db->aDb->zName + lVar4) + 0x72) & 1) == 0) {
      iVar2 = sqlite3InitOne(db,(int)lVar5,pzErrMsg);
      if (iVar2 != 0) {
        sqlite3ResetOneSchema(db,(int)lVar5);
        iVar3 = iVar2;
      }
    }
    lVar5 = lVar5 + 1;
    lVar4 = lVar4 + 0x20;
  } while( true );
}

Assistant:

SQLITE_PRIVATE int sqlite3Init(sqlite3 *db, char **pzErrMsg){
  int i, rc;
  int commit_internal = !(db->flags&SQLITE_InternChanges);
  
  assert( sqlite3_mutex_held(db->mutex) );
  assert( sqlite3BtreeHoldsMutex(db->aDb[0].pBt) );
  assert( db->init.busy==0 );
  rc = SQLITE_OK;
  db->init.busy = 1;
  ENC(db) = SCHEMA_ENC(db);
  for(i=0; rc==SQLITE_OK && i<db->nDb; i++){
    if( DbHasProperty(db, i, DB_SchemaLoaded) || i==1 ) continue;
    rc = sqlite3InitOne(db, i, pzErrMsg);
    if( rc ){
      sqlite3ResetOneSchema(db, i);
    }
  }

  /* Once all the other databases have been initialized, load the schema
  ** for the TEMP database. This is loaded last, as the TEMP database
  ** schema may contain references to objects in other databases.
  */
#ifndef SQLITE_OMIT_TEMPDB
  assert( db->nDb>1 );
  if( rc==SQLITE_OK && !DbHasProperty(db, 1, DB_SchemaLoaded) ){
    rc = sqlite3InitOne(db, 1, pzErrMsg);
    if( rc ){
      sqlite3ResetOneSchema(db, 1);
    }
  }
#endif

  db->init.busy = 0;
  if( rc==SQLITE_OK && commit_internal ){
    sqlite3CommitInternalChanges(db);
  }

  return rc; 
}